

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall ipx::Model::LoadPrimal(Model *this)

{
  char cVar1;
  int iVar2;
  pointer pcVar3;
  double *pdVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  
  this->num_rows_ = this->num_constr_;
  this->num_cols_ = this->num_var_;
  this->dualized_ = false;
  (this->AI_).nrow_ = (this->A_).nrow_;
  std::vector<int,_std::allocator<int>_>::operator=(&(this->AI_).colptr_,&(this->A_).colptr_);
  std::vector<int,_std::allocator<int>_>::operator=(&(this->AI_).rowidx_,&(this->A_).rowidx_);
  std::vector<double,_std::allocator<double>_>::operator=(&(this->AI_).values_,&(this->A_).values_);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->AI_).rowidx_queue_,&(this->A_).rowidx_queue_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->AI_).values_queue_,&(this->A_).values_queue_);
  if (0 < this->num_constr_) {
    iVar5 = 0;
    do {
      SparseMatrix::push_back(&this->AI_,iVar5,1.0);
      SparseMatrix::add_column(&this->AI_);
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->num_constr_);
  }
  sVar8 = (this->b_)._M_size;
  if (sVar8 == (this->scaled_rhs_)._M_size) {
    if (sVar8 == 0) goto LAB_003af22d;
    pdVar4 = (this->b_)._M_data;
    pdVar6 = (this->scaled_rhs_)._M_data;
  }
  else {
    pdVar4 = (this->b_)._M_data;
    if (pdVar4 != (double *)0x0) {
      operator_delete(pdVar4);
    }
    sVar8 = (this->scaled_rhs_)._M_size;
    (this->b_)._M_size = sVar8;
    pdVar4 = (double *)operator_new(sVar8 << 3);
    (this->b_)._M_data = pdVar4;
    pdVar6 = (this->scaled_rhs_)._M_data;
    if (pdVar6 == (double *)0x0) goto LAB_003af22d;
    sVar8 = (this->b_)._M_size;
  }
  memcpy(pdVar4,pdVar6,sVar8 << 3);
LAB_003af22d:
  sVar8 = (long)this->num_constr_ + (long)this->num_var_;
  if ((this->c_)._M_size != sVar8) {
    operator_delete((this->c_)._M_data);
    (this->c_)._M_size = sVar8;
    pdVar4 = (double *)operator_new(sVar8 * 8);
    (this->c_)._M_data = pdVar4;
  }
  pdVar4 = (this->c_)._M_data;
  if ((int)sVar8 != 0) {
    memset(pdVar4,0,sVar8 * 8);
  }
  pdVar6 = (double *)(this->c_)._M_size;
  if (pdVar6 != (double *)0x0) {
    memset(pdVar4,0,(long)pdVar6 * 8);
  }
  if (0 < (long)this->num_var_) {
    if (pdVar6 != (double *)0x0) {
      pdVar6 = (this->c_)._M_data;
    }
    pdVar4 = (double *)(this->scaled_obj_)._M_size;
    if (pdVar4 != (double *)0x0) {
      pdVar4 = (this->scaled_obj_)._M_data;
    }
    memmove(pdVar6,pdVar4,(long)this->num_var_ << 3);
  }
  sVar8 = (long)this->num_cols_ + (long)this->num_rows_;
  if ((this->lb_)._M_size != sVar8) {
    operator_delete((this->lb_)._M_data);
    (this->lb_)._M_size = sVar8;
    pdVar4 = (double *)operator_new(sVar8 * 8);
    (this->lb_)._M_data = pdVar4;
  }
  if ((int)sVar8 != 0) {
    memset((this->lb_)._M_data,0,sVar8 * 8);
  }
  if (0 < (long)this->num_var_) {
    pdVar4 = (double *)(this->lb_)._M_size;
    pdVar6 = (double *)(this->scaled_lbuser_)._M_size;
    if (pdVar4 != (double *)0x0) {
      pdVar4 = (this->lb_)._M_data;
    }
    if (pdVar6 != (double *)0x0) {
      pdVar6 = (this->scaled_lbuser_)._M_data;
    }
    memmove(pdVar4,pdVar6,(long)this->num_var_ << 3);
  }
  sVar8 = (long)this->num_cols_ + (long)this->num_rows_;
  if ((this->ub_)._M_size != sVar8) {
    operator_delete((this->ub_)._M_data);
    (this->ub_)._M_size = sVar8;
    pdVar4 = (double *)operator_new(sVar8 * 8);
    (this->ub_)._M_data = pdVar4;
  }
  if ((int)sVar8 != 0) {
    memset((this->ub_)._M_data,0,sVar8 * 8);
  }
  if (0 < (long)this->num_var_) {
    pdVar4 = (double *)(this->ub_)._M_size;
    pdVar6 = (double *)(this->scaled_ubuser_)._M_size;
    if (pdVar4 != (double *)0x0) {
      pdVar4 = (this->ub_)._M_data;
    }
    if (pdVar6 != (double *)0x0) {
      pdVar6 = (this->scaled_ubuser_)._M_data;
    }
    memmove(pdVar4,pdVar6,(long)this->num_var_ << 3);
  }
  iVar5 = this->num_constr_;
  if (0 < (long)iVar5) {
    iVar2 = this->num_var_;
    pdVar4 = (this->ub_)._M_data;
    pdVar6 = (this->lb_)._M_data;
    pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      cVar1 = pcVar3[lVar7];
      uVar9 = 0;
      if (cVar1 == '>') {
        uVar10 = 0xfff00000;
LAB_003af46b:
        pdVar6[iVar2 + lVar7] = (double)((ulong)uVar10 << 0x20);
        pdVar4[iVar2 + lVar7] = (double)((ulong)uVar9 << 0x20);
      }
      else {
        if (cVar1 == '=') {
          uVar10 = 0;
          goto LAB_003af46b;
        }
        if (cVar1 == '<') {
          uVar10 = 0;
          uVar9 = 0x7ff00000;
          goto LAB_003af46b;
        }
      }
      lVar7 = lVar7 + 1;
    } while (iVar5 != lVar7);
  }
  return;
}

Assistant:

void Model::LoadPrimal() {
    num_rows_ = num_constr_;
    num_cols_ = num_var_;
    dualized_ = false;

    // Copy A and append identity matrix.
    AI_ = A_;
    for (Int i = 0; i < num_constr_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }
    assert(AI_.cols() == num_var_+num_constr_);

    // Copy vectors and set bounds on slack variables.
    b_ = scaled_rhs_;
    c_.resize(num_var_+num_constr_);
    c_ = 0.0;
    std::copy_n(std::begin(scaled_obj_), num_var_, std::begin(c_));
    lb_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_lbuser_), num_var_, std::begin(lb_));
    ub_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_ubuser_), num_var_, std::begin(ub_));
    for (Int i = 0; i < num_constr_; i++) {
        switch(constr_type_[i]) {
        case '=':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = 0.0;
            break;
        case '<':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = INFINITY;
            break;
        case '>':
            lb_[num_var_+i] = -INFINITY;
            ub_[num_var_+i] = 0.0;
            break;
        }
    }
}